

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

Float __thiscall pbrt::RealisticCamera::LensFrontZ(RealisticCamera *this)

{
  LensElementInterface *element;
  LensElementInterface *pLVar1;
  long lVar2;
  float fVar3;
  
  pLVar1 = (this->elementInterfaces).ptr;
  fVar3 = 0.0;
  for (lVar2 = (this->elementInterfaces).nStored << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    fVar3 = fVar3 + pLVar1->thickness;
    pLVar1 = pLVar1 + 1;
  }
  return fVar3;
}

Assistant:

end() const { return ptr + nStored; }